

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[41],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [41],char (*Args_1) [24],
          unsigned_long *Args_2,char (*Args_3) [22],char **Args_4,char (*Args_5) [25],
          unsigned_long *Args_6,char (*Args_7) [7])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[41],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [41])this,(char (*) [24])Args,(unsigned_long *)Args_1,(char (*) [22])Args_2,
             (char **)Args_3,(char (*) [25])Args_4,(unsigned_long *)Args_5,(char (*) [7])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}